

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.h
# Opt level: O2

void __thiscall
google::protobuf::util::converter::JsonObjectWriter::WriteRawString
          (JsonObjectWriter *this,StringPiece s)

{
  io::CodedOutputStream::WriteRaw(this->stream_,s.ptr_,(int)s.length_);
  return;
}

Assistant:

void WriteRawString(StringPiece s) {
    stream_->WriteRaw(s.data(), s.length());
  }